

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void dr_prediction_z1_64xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 uVar23;
  undefined1 auVar24 [16];
  
  if (0 < N) {
    uVar2 = above[(long)N + 0x3f];
    uVar10 = (long)N + 0x3f;
    auVar17[0] = (undefined1)uVar10;
    auVar17[1] = auVar17[0];
    auVar17[2] = auVar17[0];
    auVar17[3] = auVar17[0];
    auVar17[4] = auVar17[0];
    auVar17[5] = auVar17[0];
    auVar17[6] = auVar17[0];
    auVar17[7] = auVar17[0];
    auVar17[8] = auVar17[0];
    auVar17[9] = auVar17[0];
    auVar17[10] = auVar17[0];
    auVar17[0xb] = auVar17[0];
    auVar17[0xc] = auVar17[0];
    auVar17[0xd] = auVar17[0];
    auVar17[0xe] = auVar17[0];
    auVar17[0xf] = auVar17[0];
    auVar18[1] = uVar2;
    auVar18[0] = uVar2;
    auVar18[2] = uVar2;
    auVar18[3] = uVar2;
    auVar18[4] = uVar2;
    auVar18[5] = uVar2;
    auVar18[6] = uVar2;
    auVar18[7] = uVar2;
    auVar18[8] = uVar2;
    auVar18[9] = uVar2;
    auVar18[10] = uVar2;
    auVar18[0xb] = uVar2;
    auVar18[0xc] = uVar2;
    auVar18[0xd] = uVar2;
    auVar18[0xe] = uVar2;
    auVar18[0xf] = uVar2;
    iVar13 = 0;
    auVar19._8_2_ = 0x10;
    auVar19._0_8_ = 0x10001000100010;
    auVar19._10_2_ = 0x10;
    auVar19._12_2_ = 0x10;
    auVar19._14_2_ = 0x10;
    auVar19._16_2_ = 0x10;
    auVar19._18_2_ = 0x10;
    auVar19._20_2_ = 0x10;
    auVar19._22_2_ = 0x10;
    auVar19._24_2_ = 0x10;
    auVar19._26_2_ = 0x10;
    auVar19._28_2_ = 0x10;
    auVar19._30_2_ = 0x10;
    iVar14 = N;
    uVar11 = upsample_above;
    do {
      iVar12 = (int)uVar11 >> 6;
      iVar9 = iVar14;
      if (iVar12 < (int)uVar10) {
        uVar8 = (ushort)(uVar11 >> 1);
        uVar20 = uVar8 & 0x1f;
        auVar21._0_8_ = CONCAT26(uVar8,CONCAT24(uVar8,CONCAT22(uVar8,uVar8))) & 0x1f001f001f001f;
        auVar21._8_2_ = uVar20;
        auVar21._10_2_ = uVar20;
        auVar21._12_2_ = uVar20;
        auVar21._14_2_ = uVar20;
        auVar21._16_2_ = uVar20;
        auVar21._18_2_ = uVar20;
        auVar21._20_2_ = uVar20;
        auVar21._22_2_ = uVar20;
        auVar21._24_2_ = uVar20;
        auVar21._26_2_ = uVar20;
        auVar21._28_2_ = uVar20;
        auVar21._30_2_ = uVar20;
        lVar16 = (long)iVar12;
        uVar15 = 0xfffffffffffffff0;
        do {
          if ((long)(lVar16 + uVar15 + 0x10) < (long)(uVar10 & 0xffffffff)) {
            auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar15 + lVar16 + 0x10));
            auVar7 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar15 + lVar16 + 0x11));
            auVar7 = vpsubw_avx2(auVar7,auVar22);
            auVar7 = vpmullw_avx2(auVar7,auVar21);
            auVar22 = vpsllw_avx2(auVar22,5);
            auVar22 = vpaddw_avx2(auVar22,auVar19);
            auVar22 = vpaddw_avx2(auVar7,auVar22);
            auVar22 = vpsrlw_avx2(auVar22,5);
            auVar3 = vpackuswb_avx(auVar22._0_16_,auVar22._16_16_);
            iVar9 = iVar12 + (int)uVar15;
            uVar23 = (undefined1)(iVar9 + 0x10U);
            auVar24[1] = uVar23;
            auVar24[0] = uVar23;
            auVar24[2] = uVar23;
            auVar24[3] = uVar23;
            auVar24[4] = uVar23;
            auVar24[5] = uVar23;
            auVar24[6] = uVar23;
            auVar24[7] = uVar23;
            auVar24[8] = uVar23;
            auVar24[9] = uVar23;
            auVar24[10] = uVar23;
            auVar24[0xb] = uVar23;
            auVar24[0xc] = uVar23;
            auVar24[0xd] = uVar23;
            auVar24[0xe] = uVar23;
            auVar24[0xf] = uVar23;
            auVar4 = vpaddb_avx(auVar24,SUB6416(ZEXT464(0x7060504),0));
            auVar5 = vpinsrb_avx(ZEXT416(iVar9 + 0x10U),iVar9 + 0x11,1);
            auVar5 = vpinsrb_avx(auVar5,iVar9 + 0x12,2);
            auVar6 = vpinsrb_avx(auVar5,CONCAT31((int3)((uint)iVar9 >> 8),(char)iVar9 + '\x13'),3);
            auVar5 = vpaddb_avx(auVar24,ZEXT816(0xf0e0d0c0b0a0908));
            auVar4 = vpunpckldq_avx(auVar6,auVar4);
            auVar4 = vpunpcklqdq_avx(auVar4,auVar5);
            auVar4 = vpsubusb_avx(auVar17,auVar4);
            auVar4 = vpcmpgtb_avx(auVar4,(undefined1  [16])0x0);
            auVar3 = vpblendvb_avx(auVar18,auVar3,auVar4);
            *(undefined1 (*) [16])(dst + uVar15 + 0x10) = auVar3;
          }
          else {
            puVar1 = dst + uVar15 + 0x10;
            *puVar1 = uVar2;
            puVar1[1] = uVar2;
            puVar1[2] = uVar2;
            puVar1[3] = uVar2;
            puVar1[4] = uVar2;
            puVar1[5] = uVar2;
            puVar1[6] = uVar2;
            puVar1[7] = uVar2;
            puVar1[8] = uVar2;
            puVar1[9] = uVar2;
            puVar1[10] = uVar2;
            puVar1[0xb] = uVar2;
            puVar1[0xc] = uVar2;
            puVar1[0xd] = uVar2;
            puVar1[0xe] = uVar2;
            puVar1[0xf] = uVar2;
          }
          uVar15 = uVar15 + 0x10;
        } while (uVar15 < 0x30);
        uVar11 = uVar11 + upsample_above;
      }
      else {
        do {
          *dst = uVar2;
          dst[1] = uVar2;
          dst[2] = uVar2;
          dst[3] = uVar2;
          dst[4] = uVar2;
          dst[5] = uVar2;
          dst[6] = uVar2;
          dst[7] = uVar2;
          dst[8] = uVar2;
          dst[9] = uVar2;
          dst[10] = uVar2;
          dst[0xb] = uVar2;
          dst[0xc] = uVar2;
          dst[0xd] = uVar2;
          dst[0xe] = uVar2;
          dst[0xf] = uVar2;
          dst[0x10] = uVar2;
          dst[0x11] = uVar2;
          dst[0x12] = uVar2;
          dst[0x13] = uVar2;
          dst[0x14] = uVar2;
          dst[0x15] = uVar2;
          dst[0x16] = uVar2;
          dst[0x17] = uVar2;
          dst[0x18] = uVar2;
          dst[0x19] = uVar2;
          dst[0x1a] = uVar2;
          dst[0x1b] = uVar2;
          dst[0x1c] = uVar2;
          dst[0x1d] = uVar2;
          dst[0x1e] = uVar2;
          dst[0x1f] = uVar2;
          dst[0x20] = uVar2;
          dst[0x21] = uVar2;
          dst[0x22] = uVar2;
          dst[0x23] = uVar2;
          dst[0x24] = uVar2;
          dst[0x25] = uVar2;
          dst[0x26] = uVar2;
          dst[0x27] = uVar2;
          dst[0x28] = uVar2;
          dst[0x29] = uVar2;
          dst[0x2a] = uVar2;
          dst[0x2b] = uVar2;
          dst[0x2c] = uVar2;
          dst[0x2d] = uVar2;
          dst[0x2e] = uVar2;
          dst[0x2f] = uVar2;
          dst[0x30] = uVar2;
          dst[0x31] = uVar2;
          dst[0x32] = uVar2;
          dst[0x33] = uVar2;
          dst[0x34] = uVar2;
          dst[0x35] = uVar2;
          dst[0x36] = uVar2;
          dst[0x37] = uVar2;
          dst[0x38] = uVar2;
          dst[0x39] = uVar2;
          dst[0x3a] = uVar2;
          dst[0x3b] = uVar2;
          dst[0x3c] = uVar2;
          dst[0x3d] = uVar2;
          dst[0x3e] = uVar2;
          dst[0x3f] = uVar2;
          dst = dst + stride;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      if ((int)uVar10 <= iVar12) {
        return;
      }
      iVar13 = iVar13 + 1;
      dst = dst + stride;
      iVar14 = iVar14 + -1;
    } while (iVar13 < N);
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16;
  __m256i a_mbase_x, diff, c3f;
  __m128i max_base_x128, base_inc128, mask128;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi8((int8_t)above[max_base_x]);
  max_base_x128 = _mm_set1_epi8(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    __m128i a0_128, a1_128, res128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j),
                         _mm256_castsi256_si128(a_mbase_x));
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu8_epi16(a0_128);
        a1 = _mm256_cvtepu8_epi16(a1_128);

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);
        res = _mm256_packus_epi16(
            res, _mm256_castsi128_si256(
                     _mm256_extracti128_si256(res, 1)));  // 16 8bit values

        base_inc128 =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask128 = _mm_cmpgt_epi8(_mm_subs_epu8(max_base_x128, base_inc128),
                                 _mm_setzero_si128());
        res128 = _mm_blendv_epi8(_mm256_castsi256_si128(a_mbase_x),
                                 _mm256_castsi256_si128(res), mask128);
        _mm_storeu_si128((__m128i *)(dst + j), res128);
      }
    }
    x += dx;
  }
}